

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O2

size_t __thiscall Apt::AddTaxiEdge(Apt *this,size_t n1,size_t n2,edgeTy _type)

{
  reference pvVar1;
  reference pvVar2;
  size_t sVar3;
  edgeTy _type_local;
  size_t eIdx;
  size_t n2_local;
  size_t n1_local;
  double local_30;
  
  _type_local = _type;
  n2_local = n2;
  n1_local = n1;
  pvVar1 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::at(&this->vecTaxiNodes,n1);
  pvVar2 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::at(&this->vecTaxiNodes,n2);
  if ((((NAN(pvVar1->lat)) || (NAN(pvVar1->lon))) || (NAN(pvVar2->lat))) || (NAN(pvVar2->lon))) {
    sVar3 = 0xffffffffffffffff;
    if ((int)dataRefs.iLogLevel < 1) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
             ,0x1f2,"AddTaxiEdge",logDEBUG,"apt.dat: Node %lu or %lu invalid! Edge not added.",n1,n2
            );
    }
  }
  else {
    eIdx = (size_t)CoordAngle(pvVar1->lat,pvVar1->lon,pvVar2->lat,pvVar2->lon);
    local_30 = DistLatLon(pvVar1->lat,pvVar1->lon,pvVar2->lat,pvVar2->lon);
    std::vector<TaxiEdge,std::allocator<TaxiEdge>>::
    emplace_back<TaxiEdge::edgeTy&,unsigned_long&,unsigned_long&,double,double>
              ((vector<TaxiEdge,std::allocator<TaxiEdge>> *)&this->vecTaxiEdges,&_type_local,
               &n1_local,&n2_local,(double *)&eIdx,&local_30);
    eIdx = ((long)(this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x28 - 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&pvVar1->vecEdges,&eIdx);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&pvVar2->vecEdges,&eIdx);
    sVar3 = eIdx;
  }
  return sVar3;
}

Assistant:

size_t AddTaxiEdge (size_t n1, size_t n2,
                        TaxiEdge::edgeTy _type = TaxiEdge::TAXI_WAY)
    {
        // Actual nodes must be valid, throws exception if not
        TaxiNode& a = vecTaxiNodes.at(n1);
        TaxiNode& b = vecTaxiNodes.at(n2);
        if (!a.HasGeoCoords() || !b.HasGeoCoords())
        {
            LOG_MSG(logDEBUG, "apt.dat: Node %lu or %lu invalid! Edge not added.",
                    (long unsigned)n1, (long unsigned)n2);
            return ULONG_MAX;
        }
        
        // Add the edge
        vecTaxiEdges.emplace_back(_type, n1, n2,
                                  CoordAngle(a.lat, a.lon, b.lat, b.lon),
                                  DistLatLon(a.lat, a.lon, b.lat, b.lon));
        
        // Tell the nodes they've got a new connection
        const size_t eIdx = vecTaxiEdges.size()-1;
        a.vecEdges.push_back(eIdx);
        b.vecEdges.push_back(eIdx);
        
        return eIdx;
    }